

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void ts_lexer_finish(Lexer *self,uint32_t *lookahead_end_byte)

{
  uint32_t uVar1;
  _Bool _Var2;
  uint local_2c;
  uint32_t current_lookahead_end_byte;
  uint32_t *lookahead_end_byte_local;
  Lexer *self_local;
  
  _Var2 = length_is_undefined(self->token_end_position);
  if (_Var2) {
    ts_lexer__mark_end(&self->data);
  }
  uVar1 = (self->current_position).bytes;
  local_2c = uVar1 + 1;
  if ((self->data).lookahead == -1) {
    local_2c = uVar1 + 2;
  }
  if (*lookahead_end_byte < local_2c) {
    *lookahead_end_byte = local_2c;
  }
  return;
}

Assistant:

void ts_lexer_finish(Lexer *self, uint32_t *lookahead_end_byte) {
  if (length_is_undefined(self->token_end_position)) {
    ts_lexer__mark_end(&self->data);
  }

  uint32_t current_lookahead_end_byte = self->current_position.bytes + 1;

  // In order to determine that a byte sequence is invalid UTF8 or UTF16,
  // the character decoding algorithm may have looked at the following byte.
  // Therefore, the next byte *after* the current (invalid) character
  // affects the interpretation of the current character.
  if (self->data.lookahead == -1) {
    current_lookahead_end_byte++;
  }

  if (current_lookahead_end_byte > *lookahead_end_byte) {
    *lookahead_end_byte = current_lookahead_end_byte;
  }
}